

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType * reduce_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *dt)

{
  MOJOSHADER_astDataType *pMVar1;
  bool bVar2;
  MOJOSHADER_astDataTypeUser *user;
  MOJOSHADER_astDataType *retval;
  MOJOSHADER_astDataType *dt_local;
  Context_conflict *ctx_local;
  
  user = (MOJOSHADER_astDataTypeUser *)dt;
  while( true ) {
    bVar2 = false;
    if (user != (MOJOSHADER_astDataTypeUser *)0x0) {
      bVar2 = user->type == MOJOSHADER_AST_DATATYPE_USER;
    }
    if (!bVar2) break;
    if (user->details->type == MOJOSHADER_AST_DATATYPE_NONE) {
      pMVar1 = get_usertype(ctx,user->name);
      user->details = pMVar1;
      if (user->details == (MOJOSHADER_astDataType *)0x0) {
        __assert_fail("user->details != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x74c,
                      "const MOJOSHADER_astDataType *reduce_datatype(Context *, const MOJOSHADER_astDataType *)"
                     );
      }
    }
    user = (MOJOSHADER_astDataTypeUser *)user->details;
  }
  return (MOJOSHADER_astDataType *)user;
}

Assistant:

static const MOJOSHADER_astDataType *reduce_datatype(Context *ctx, const MOJOSHADER_astDataType *dt)
{
    const MOJOSHADER_astDataType *retval = dt;
    while (retval && retval->type == MOJOSHADER_AST_DATATYPE_USER)
    {
        // !!! FIXME: Ugh, const removal.
        MOJOSHADER_astDataTypeUser *user = (MOJOSHADER_astDataTypeUser *) &retval->user;
        if (user->details->type == MOJOSHADER_AST_DATATYPE_NONE)
        {
            // Take this opportunity to fix up some usertype stubs that were
            //  left over from the parse phase. You HAVE to catch these in the
            //  right scope, so be aggressive about calling reduce_datatype()
            //  as soon as things come into view!
            user->details = get_usertype(ctx, user->name);
            assert(user->details != NULL);
        } // if

        retval = user->details;
    } // while

    return retval;
}